

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O2

void __thiscall
shift_window_transformer::WindowAttention<float>::reArrange
          (WindowAttention<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  pointer pfVar6;
  pointer pfVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int k;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  piVar5 = (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)piVar5 == 0xc) {
    iVar10 = *piVar5;
    iVar15 = piVar5[1];
    local_38 = this->windowSize;
    local_40 = this->heads;
    iVar9 = piVar5[2] / local_40;
    local_3c = (iVar15 / local_38) * (iVar10 / local_38);
    local_38 = local_38 * local_38;
    local_34 = iVar9;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&output->shape,&local_40);
    std::vector<float,_std::allocator<float>_>::resize
              (&output->super_vector<float,_std::allocator<float>_>,
               (long)(input->super_vector<float,_std::allocator<float>_>).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(input->super_vector<float,_std::allocator<float>_>).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    piVar5 = (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = piVar5[2];
    iVar2 = *piVar5;
    iVar3 = piVar5[1];
    iVar4 = this->windowSize;
    uVar12 = 0;
    if (0 < (int)uVar1) {
      uVar12 = (ulong)uVar1;
    }
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    iVar16 = 0;
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    for (iVar11 = 0; iVar11 != iVar10; iVar11 = iVar11 + 1) {
      iVar17 = iVar16;
      for (iVar13 = 0; iVar13 != iVar15; iVar13 = iVar13 + 1) {
        pfVar6 = (input->super_vector<float,_std::allocator<float>_>).
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        pfVar7 = (output->super_vector<float,_std::allocator<float>_>).
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
          uVar8 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
          pfVar7[((int)((long)uVar8 / (long)iVar9) * iVar2 * iVar3 + iVar13 % iVar4 +
                 ((iVar13 / iVar4 + (iVar11 / iVar4) * (iVar2 / iVar4)) * iVar4 + iVar11 % iVar4) *
                 iVar4) * iVar9 + (int)((long)uVar8 % (long)iVar9)] = pfVar6[iVar17 + (int)uVar14];
        }
        iVar17 = iVar17 + uVar1;
      }
      iVar16 = iVar16 + iVar3 * uVar1;
    }
    return;
  }
  __assert_fail("input.shape.size() == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                ,0x42,
                "void shift_window_transformer::WindowAttention<float>::reArrange(const Tensor<T> &, Tensor<T> &) [T = float]"
               );
}

Assistant:

void reArrange(const Tensor<T> &input, Tensor<T> &output) {
            assert(input.shape.size() == 3);
            int n_h = input.shape[0], n_w = input.shape[1];
            int nw_h = input.shape[0] / windowSize, nw_w = input.shape[1] / windowSize;
            int dim = input.shape[2] / heads;
            output.shape = {heads, nw_h * nw_w, windowSize * windowSize, dim};
            output.resize(input.size());
            int lock_j = input.shape[2];
            int lock_i = lock_j * input.shape[1];
            int key_c = dim;
            int key_b = key_c * windowSize * windowSize;
            int key_a = key_c * input.shape[0] * input.shape[1];
            for (int i = 0; i < n_h; ++i) {
                for (int j = 0; j < n_w; ++j) {
                    for (int k = 0; k < input.shape[2]; ++k) {
                        int a = k / dim;
                        int b = i / windowSize * (input.shape[0] / windowSize) + j / windowSize;
                        int c = i % windowSize * windowSize + j % windowSize;
                        int d = k % dim;
                        output[a * key_a + b * key_b + c * key_c + d] = input[i * lock_i + j * lock_j + k];
                    }
                }
            }
        }